

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astMakeDictionaryNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_functionBytecodeDirectCompiler_t *compiler_;
  sysbvm_tuple_t *psVar1;
  size_t slotCount;
  sysbvm_tuple_t sVar2;
  size_t local_88;
  size_t i;
  size_t arrayElementCountCount;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_24_3_473bb44d gcFrame;
  sysbvm_astMakeDictionaryNode_t **dictionaryNode;
  sysbvm_functionBytecodeDirectCompiler_t **compiler;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar1 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0x18);
  memset(&arrayElementCountCount,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_JIT_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&arrayElementCountCount);
  slotCount = sysbvm_array_getSize(*(sysbvm_tuple_t *)(*arguments + 0x28));
  gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_array_create(context,slotCount);
  for (local_88 = 0; local_88 < slotCount; local_88 = local_88 + 1) {
    compiler_ = (sysbvm_functionBytecodeDirectCompiler_t *)*psVar1;
    sVar2 = sysbvm_array_at(*(sysbvm_tuple_t *)(*arguments + 0x28),local_88);
    sVar2 = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context,compiler_,sVar2);
    sysbvm_array_atPut((sysbvm_tuple_t)gcFrameRecord.roots,local_88,sVar2);
  }
  sVar2 = sysbvm_functionBytecodeAssembler_newTemporary
                    (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),
                     *(sysbvm_tuple_t *)(*arguments + 0x20));
  sysbvm_functionBytecodeAssembler_makeDictionaryWithElements
            (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),sVar2,
             (sysbvm_tuple_t)gcFrameRecord.roots);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&arrayElementCountCount);
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMakeDictionaryNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astMakeDictionaryNode_t **dictionaryNode = (sysbvm_astMakeDictionaryNode_t**)node;
    struct {
        sysbvm_tuple_t elements;
        sysbvm_tuple_t element;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    size_t arrayElementCountCount = sysbvm_array_getSize((*dictionaryNode)->elements);
    gcFrame.elements = sysbvm_array_create(context, arrayElementCountCount);
    for(size_t i = 0; i < arrayElementCountCount; ++i)
    {
        gcFrame.element = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, sysbvm_array_at((*dictionaryNode)->elements, i));
        sysbvm_array_atPut(gcFrame.elements, i, gcFrame.element);
    }

    gcFrame.result = sysbvm_functionBytecodeAssembler_newTemporary(context, (*compiler)->assembler, (*dictionaryNode)->super.analyzedType);
    sysbvm_functionBytecodeAssembler_makeDictionaryWithElements(context, (*compiler)->assembler, gcFrame.result, gcFrame.elements);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}